

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O1

int lyb_parse_model(char *data,lys_module **mod,lyb_state *lybs)

{
  uint uVar1;
  int iVar2;
  lys_module *plVar3;
  int iVar4;
  char *format;
  ushort *revision;
  int iVar5;
  ly_ctx *plVar6;
  void *pvVar7;
  char *pcVar8;
  ushort *buf;
  ushort local_58 [4];
  char mod_rev [11];
  char *local_40;
  char *mod_name;
  
  local_40 = (char *)0x0;
  unique0x10000197 = mod;
  uVar1 = lyb_read_string(data,&local_40,1,lybs);
  if ((int)uVar1 < 0) {
    iVar5 = -1;
    goto LAB_001451c3;
  }
  buf = local_58;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  iVar2 = lyb_read(data + uVar1,(uint8_t *)buf,2,lybs);
  iVar5 = -1;
  if (iVar2 < 0) goto LAB_001451c3;
  mod_name._6_2_ = local_58[0];
  if (local_58[0] == 0) {
    plVar6 = lybs->ctx;
    revision = (ushort *)0x0;
  }
  else {
    sprintf((char *)local_58,"%04u-%02u-%02u",(ulong)((local_58[0] >> 9) + 2000),
            (ulong)(local_58[0] >> 5 & 0xf),(ulong)(local_58[0] & 0x1f));
    plVar6 = lybs->ctx;
    revision = local_58;
  }
  plVar3 = ly_ctx_get_module(plVar6,local_40,(char *)revision,0);
  *stack0xffffffffffffffb8 = plVar3;
  plVar6 = lybs->ctx;
  if (plVar6->data_clb != (ly_module_data_clb)0x0) {
    if (plVar3 == (lys_module *)0x0) {
      pvVar7 = plVar6->data_clb_data;
      pcVar8 = (char *)0x0;
      iVar4 = 0;
    }
    else {
      if ((plVar3->field_0x40 & 0x80) != 0) goto LAB_00145141;
      pcVar8 = plVar3->ns;
      pvVar7 = plVar6->data_clb_data;
      iVar4 = 1;
    }
    plVar3 = (*plVar6->data_clb)(plVar6,local_40,pcVar8,iVar4,pvVar7);
    *stack0xffffffffffffffb8 = plVar3;
  }
LAB_00145141:
  if (*stack0xffffffffffffffb8 == (lys_module *)0x0) {
    plVar6 = lybs->ctx;
    pcVar8 = "@";
    if (mod_name._6_2_ == 0) {
      pcVar8 = "";
      buf = (ushort *)0x1a4a36;
    }
    format = "Invalid context for LYB data parsing, missing module \"%s%s%s\".";
  }
  else {
    if (((*stack0xffffffffffffffb8)->field_0x40 & 0x80) != 0) {
      iVar5 = iVar2 + uVar1;
      goto LAB_001451c3;
    }
    plVar6 = lybs->ctx;
    pcVar8 = "@";
    if (mod_name._6_2_ == 0) {
      pcVar8 = "";
      buf = (ushort *)0x1a4a36;
    }
    format = "Invalid context for LYB data parsing, module \"%s%s%s\" not implemented.";
  }
  ly_log(plVar6,LY_LLERR,LY_EINVAL,format,local_40,pcVar8,buf);
LAB_001451c3:
  free(local_40);
  return iVar5;
}

Assistant:

static int
lyb_parse_model(const char *data, const struct lys_module **mod, struct lyb_state *lybs)
{
    int r, ret = 0;
    char *mod_name = NULL, mod_rev[11];
    uint16_t rev;

    /* model name */
    ret += (r = lyb_read_string(data, &mod_name, 1, lybs));
    LYB_HAVE_READ_GOTO(r, data, error);

    /* revision */
    ret += (r = lyb_read_number(&rev, sizeof rev, 2, data, lybs));
    LYB_HAVE_READ_GOTO(r, data, error);

    if (rev) {
        sprintf(mod_rev, "%04u-%02u-%02u", ((rev & 0xFE00) >> 9) + 2000, (rev & 0x01E0) >> 5, (rev & 0x001F));
        *mod = ly_ctx_get_module(lybs->ctx, mod_name, mod_rev, 0);
    } else {
        *mod = ly_ctx_get_module(lybs->ctx, mod_name, NULL, 0);
    }
    if (lybs->ctx->data_clb) {
        if (!*mod) {
            *mod = lybs->ctx->data_clb(lybs->ctx, mod_name, NULL, 0, lybs->ctx->data_clb_data);
        } else if (!(*mod)->implemented) {
            *mod = lybs->ctx->data_clb(lybs->ctx, mod_name, (*mod)->ns, LY_MODCLB_NOT_IMPLEMENTED, lybs->ctx->data_clb_data);
        }
    }

    if (!*mod) {
        LOGERR(lybs->ctx, LY_EINVAL, "Invalid context for LYB data parsing, missing module \"%s%s%s\".",
               mod_name, rev ? "@" : "", rev ? mod_rev : "");
        goto error;
    } else if (!(*mod)->implemented) {
        LOGERR(lybs->ctx, LY_EINVAL, "Invalid context for LYB data parsing, module \"%s%s%s\" not implemented.",
               mod_name, rev ? "@" : "", rev ? mod_rev : "");
        goto error;
    }

    free(mod_name);
    return ret;

error:
    free(mod_name);
    return -1;
}